

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.h
# Opt level: O1

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::~cmInstallImportedRuntimeArtifactsGenerator
          (cmInstallImportedRuntimeArtifactsGenerator *this)

{
  ~cmInstallImportedRuntimeArtifactsGenerator(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

~cmInstallImportedRuntimeArtifactsGenerator() override = default;